

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOLoader.cpp
# Opt level: O2

VMapEntry *
FindEntry<Assimp::LWO::UVChannel>
          (vector<Assimp::LWO::UVChannel,_std::allocator<Assimp::LWO::UVChannel>_> *list,
          string *name,bool perPoly)

{
  VMapEntry *pVVar1;
  pointer pUVar2;
  __type _Var3;
  Logger *this;
  UVChannel *elem;
  VMapEntry *pVVar4;
  VMapEntry *unaff_R14;
  VMapEntry local_a0;
  
  pVVar4 = &((list->
             super__Vector_base<Assimp::LWO::UVChannel,_std::allocator<Assimp::LWO::UVChannel>_>).
             _M_impl.super__Vector_impl_data._M_start)->super_VMapEntry;
  pVVar1 = &((list->
             super__Vector_base<Assimp::LWO::UVChannel,_std::allocator<Assimp::LWO::UVChannel>_>).
             _M_impl.super__Vector_impl_data._M_finish)->super_VMapEntry;
  do {
    if (pVVar4 == pVVar1) {
      Assimp::LWO::UVChannel::UVChannel((UVChannel *)&local_a0);
      std::vector<Assimp::LWO::UVChannel,_std::allocator<Assimp::LWO::UVChannel>_>::
      emplace_back<Assimp::LWO::UVChannel>(list,(UVChannel *)&local_a0);
      Assimp::LWO::VMapEntry::~VMapEntry(&local_a0);
      pUVar2 = (list->
               super__Vector_base<Assimp::LWO::UVChannel,_std::allocator<Assimp::LWO::UVChannel>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      std::__cxx11::string::_M_assign((string *)&pUVar2[-1].super_VMapEntry.name);
      return &pUVar2[-1].super_VMapEntry;
    }
    _Var3 = std::operator==(&pVVar4->name,name);
    if (_Var3) {
      unaff_R14 = pVVar4;
    }
    if (_Var3 && !perPoly) {
      this = Assimp::DefaultLogger::get();
      Assimp::Logger::warn(this,"LWO2: Found two VMAP sections with equal names");
      unaff_R14 = pVVar4;
    }
    pVVar4 = pVVar4 + 1;
  } while (!_Var3);
  return unaff_R14;
}

Assistant:

VMapEntry* FindEntry(std::vector< T >& list,const std::string& name, bool perPoly)
{
    for (auto & elem : list)   {
        if (elem.name == name) {
            if (!perPoly)   {
                ASSIMP_LOG_WARN("LWO2: Found two VMAP sections with equal names");
            }
            return &elem;
        }
    }
    list.push_back( T() );
    VMapEntry* p = &list.back();
    p->name = name;
    return p;
}